

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

size_t __thiscall
mocker::ir::Builder::getTypeSize(Builder *this,shared_ptr<mocker::ast::Type> *type)

{
  BuilderContext *this_00;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  undefined1 local_68 [8];
  shared_ptr<mocker::ast::ArrayType> p_2;
  undefined1 local_48 [8];
  shared_ptr<mocker::ast::UserDefinedType> p_1;
  undefined1 local_30 [8];
  shared_ptr<mocker::ast::BuiltinType> p;
  shared_ptr<mocker::ast::Type> *type_local;
  Builder *this_local;
  
  p.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)type;
  std::dynamic_pointer_cast<mocker::ast::BuiltinType,mocker::ast::Type>
            ((shared_ptr<mocker::ast::Type> *)local_30);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    if (peVar2->type == String) {
      this_local = (Builder *)0x10;
      p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = 1;
    }
    else {
      peVar2 = std::
               __shared_ptr_access<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_30);
      if (peVar2->type == Null) {
        __assert_fail("p->type != ast::BuiltinType::Null",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                      ,0x3df,
                      "std::size_t mocker::ir::Builder::getTypeSize(const std::shared_ptr<ast::Type> &) const"
                     );
      }
      this_local = (Builder *)0x8;
      p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ = 1;
    }
  }
  else {
    p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 0;
  }
  std::shared_ptr<mocker::ast::BuiltinType>::~shared_ptr
            ((shared_ptr<mocker::ast::BuiltinType> *)local_30);
  if (p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_4_ == 0) {
    std::dynamic_pointer_cast<mocker::ast::UserDefinedType,mocker::ast::Type>
              ((shared_ptr<mocker::ast::Type> *)local_48);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_48);
    if (bVar1) {
      this_00 = this->ctx;
      peVar3 = std::
               __shared_ptr_access<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_48);
      peVar4 = std::
               __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar3->name);
      this_local = (Builder *)BuilderContext::getClassSize(this_00,&peVar4->val);
    }
    p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._5_3_ = 0;
    p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_1_ = bVar1;
    std::shared_ptr<mocker::ast::UserDefinedType>::~shared_ptr
              ((shared_ptr<mocker::ast::UserDefinedType> *)local_48);
    if (p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi._4_4_ == 0) {
      std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
                ((shared_ptr<mocker::ast::Type> *)local_68);
      p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_1_ = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
      if (p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_1_) {
        this_local = (Builder *)0x10;
      }
      p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._5_3_ = 0;
      std::shared_ptr<mocker::ast::ArrayType>::~shared_ptr
                ((shared_ptr<mocker::ast::ArrayType> *)local_68);
      if (p_1.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ == 0) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                      ,1000,
                      "std::size_t mocker::ir::Builder::getTypeSize(const std::shared_ptr<ast::Type> &) const"
                     );
      }
    }
  }
  return (size_t)this_local;
}

Assistant:

std::size_t Builder::getTypeSize(const std::shared_ptr<ast::Type> &type) const {
  if (auto p = std::dynamic_pointer_cast<ast::BuiltinType>(type)) {
    if (p->type == ast::BuiltinType::String)
      return 16;
    assert(p->type != ast::BuiltinType::Null);
    return 8;
  }
  if (auto p = std::dynamic_pointer_cast<ast::UserDefinedType>(type)) {
    return ctx.getClassSize(p->name->val);
  }
  if (auto p = std::dynamic_pointer_cast<ast::ArrayType>(type)) {
    return 16;
  }
  assert(false);
}